

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::inf_or_nan_writer::operator()
          (inf_or_nan_writer *this,
          truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  char cVar1;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> it_00;
  value_type *pvVar2;
  undefined8 *in_RSI;
  char *in_RDI;
  undefined8 in_stack_ffffffffffffff58;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_30;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  if (*in_RDI != '\0') {
    cVar1 = *in_RDI;
    internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    pvVar2 = internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator*
                       (&local_30);
    *pvVar2 = cVar1;
  }
  it_00.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffffb8;
  it_00.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffffb0;
  it_00.super_truncating_iterator_base<char_*>.count_ = in_stack_ffffffffffffffc0;
  it_00.blackhole_ = in_stack_ffffffffffffffc8;
  it_00._25_7_ = in_stack_ffffffffffffffc9;
  internal::
  copy_str<char,char_const*,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>>
            ((char *)local_10[2],(char *)local_10[1],it_00);
  *local_10 = in_stack_ffffffffffffffb0;
  local_10[1] = in_stack_ffffffffffffffb8;
  local_10[2] = in_stack_ffffffffffffffc0;
  *(undefined1 *)(local_10 + 3) = in_stack_ffffffffffffffc8;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }